

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_8be0b9::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  CopyResult CVar5;
  int iVar6;
  string *psVar7;
  pointer member;
  char *pcVar8;
  size_t sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  ActionMap *pAVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  static_string_view name;
  static_string_view name_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  Arguments arguments;
  string newname;
  string oldname;
  undefined1 local_128 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string err;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  _Any_data _Stack_b0;
  undefined1 auStack_a0 [16];
  _Any_data _Stack_90;
  pointer ppStack_80;
  pointer local_78;
  pointer ppStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  member = (pointer)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2);
  if (member < (pointer)0x41) {
    local_d8._0_8_ = (ActionMap *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"COPY_FILE must be called with at least two additional arguments",
               "");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_d8._0_8_ != (ActionMap *)local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
    }
    return false;
  }
  pcVar3 = pbVar2[1]._M_dataplus._M_p;
  oldname._M_dataplus._M_p = (pointer)&oldname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oldname,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(&oldname);
  if (!bVar4) {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_d8._8_8_ = (psVar7->_M_dataplus)._M_p;
    local_d8._0_8_ = psVar7->_M_string_length;
    local_128._8_8_ = &local_118;
    local_128._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_118._M_dataplus._M_p._0_1_ = '/';
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c8._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    _Stack_b0._M_unused._M_object = pbVar2[1]._M_dataplus._M_p;
    member = (pointer)pbVar2[1]._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_d8;
    local_c8._8_8_ = local_128._8_8_;
    local_c8._16_8_ = member;
    cmCatViews_abi_cxx11_((string *)&arguments,views);
    std::__cxx11::string::operator=((string *)&oldname,(string *)&arguments);
    if ((size_type *)CONCAT71(arguments._1_7_,arguments.OnlyIfDifferent) !=
        &arguments.Result._M_string_length) {
      operator_delete((undefined1 *)CONCAT71(arguments._1_7_,arguments.OnlyIfDifferent),
                      arguments.Result._M_string_length + 1);
    }
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  newname._M_dataplus._M_p = (pointer)&newname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&newname,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(&newname);
  if (!bVar4) {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_d8._8_8_ = (psVar7->_M_dataplus)._M_p;
    local_d8._0_8_ = psVar7->_M_string_length;
    local_128._8_8_ = &local_118;
    local_128._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_118._M_dataplus._M_p._0_1_ = '/';
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c8._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    _Stack_b0._M_unused._M_object = pbVar2[2]._M_dataplus._M_p;
    member = (pointer)pbVar2[2]._M_string_length;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_d8;
    local_c8._8_8_ = local_128._8_8_;
    local_c8._16_8_ = member;
    cmCatViews_abi_cxx11_((string *)&arguments,views_00);
    std::__cxx11::string::operator=((string *)&newname,(string *)&arguments);
    if ((size_type *)CONCAT71(arguments._1_7_,arguments.OnlyIfDifferent) !=
        &arguments.Result._M_string_length) {
      operator_delete((undefined1 *)CONCAT71(arguments._1_7_,arguments.OnlyIfDifferent),
                      arguments.Result._M_string_length + 1);
    }
  }
  if (((anonymous_namespace)::
       HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar6 != 0)) {
    local_78 = (pointer)0x0;
    ppStack_70 = (pointer)0x0;
    _Stack_90._8_8_ = (_Manager_type)0x0;
    ppStack_80 = (pointer)0x0;
    auStack_a0._8_8_ = 0;
    _Stack_90._0_8_ = 0;
    _Stack_b0._8_8_ = 0;
    auStack_a0._0_8_ = (_Manager_type)0x0;
    local_c8._16_8_ = (pointer)0x0;
    _Stack_b0._M_unused._M_object = (char *)0x0;
    local_c8._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_c8._8_8_ = (void *)0x0;
    local_d8._0_8_ = (ActionMap *)0x0;
    local_d8._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "ONLY_IF_DIFFERENT";
    name.super_string_view._M_len = 0x11;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)local_d8,name,(offset_in_Arguments_to_bool)member);
    name_00.super_string_view._M_str = "RESULT";
    name_00.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_d8,name_00,
               (offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                )member);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&HandleCopyFile::parser,(ActionMap *)local_d8)
    ;
    ArgumentParser::Base::~Base((Base *)local_d8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCopyFile::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_c8._0_8_ = &unconsumedArgs;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_128._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  paVar1 = &arguments.Result.field_2;
  arguments.OnlyIfDifferent = false;
  arguments.Result._M_string_length = 0;
  arguments.Result.field_2._M_local_buf[0] = '\0';
  local_d8._0_8_ = &HandleCopyFile::parser;
  local_d8._8_8_ = (pointer)0x0;
  local_c8._8_8_ = &arguments;
  local_c8._16_8_ = (pointer)0x0;
  _Stack_b0._M_unused._M_object = (char *)0x0;
  _Stack_b0._8_8_ = 0;
  auStack_a0._0_8_ = (_Manager_type)0x0;
  auStack_a0._8_8_ = 0;
  _Stack_90._0_8_ = 0;
  _Stack_90._8_8_ = (_Manager_type)0x0;
  ppStack_80 = (pointer)0x0;
  local_78 = (pointer)((ulong)local_78 & 0xffffffffffffff00);
  arguments.Result._M_dataplus._M_p = (pointer)paVar1;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_d8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_128,0);
  if ((_Manager_type)_Stack_90._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_90._8_8_)(auStack_a0 + 8,auStack_a0 + 8,3);
  }
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = cmsys::SystemTools::FileIsDirectory(&oldname);
    psVar7 = &arguments.Result;
    if (bVar4) {
      if (arguments.Result._M_string_length == 0) {
        local_d8._0_8_ = (ActionMap *)0x24;
        local_d8._8_8_ = "COPY_FILE cannot copy a directory\n  ";
        local_c8._0_8_ = oldname._M_string_length;
        local_c8._8_8_ = oldname._M_dataplus._M_p;
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_d8;
        cmCatViews_abi_cxx11_((string *)local_128,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00264bbd:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
            &local_118) {
          pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT71(local_118._M_dataplus._M_p._1_7_,local_118._M_dataplus._M_p._0_1_);
          pAVar11 = (ActionMap *)local_128._0_8_;
          goto LAB_002649de;
        }
        goto LAB_002649e6;
      }
      pcVar8 = "cannot copy a directory";
      sVar9 = 0x17;
    }
    else {
      bVar4 = cmsys::SystemTools::FileIsDirectory(&newname);
      if (!bVar4) {
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        CVar5 = cmSystemTools::CopySingleFile
                          (&oldname,&newname,(uint)arguments.OnlyIfDifferent,&err);
        if (CVar5 == Success) {
          bVar4 = true;
          if (arguments.Result._M_string_length != 0) {
            value_01._M_str = "0";
            value_01._M_len = 1;
            cmMakefile::AddDefinition(status->Makefile,psVar7,value_01);
          }
        }
        else if (arguments.Result._M_string_length == 0) {
          local_d8._0_8_ = (ActionMap *)0x1b;
          local_d8._8_8_ = "COPY_FILE failed to copy\n  ";
          local_128._0_8_ = oldname._M_string_length;
          local_128._8_8_ = oldname._M_dataplus._M_p;
          cmStrCat<char[7],std::__cxx11::string,char[11],std::__cxx11::string,char[2]>
                    (&local_50,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_128,
                     (char (*) [7])"\nto\n  ",&newname,(char (*) [11])"\nbecause: ",&err,
                     (char (*) [2])0x6d6398);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
        }
        else {
          bVar4 = true;
          value_00._M_str = err._M_dataplus._M_p;
          value_00._M_len = err._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,psVar7,value_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)err._M_dataplus._M_p != &err.field_2) {
          operator_delete(err._M_dataplus._M_p,
                          CONCAT71(err.field_2._M_allocated_capacity._1_7_,
                                   err.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_002649e8;
      }
      if (arguments.Result._M_string_length == 0) {
        local_d8._0_8_ = &DAT_00000027;
        local_d8._8_8_ = "COPY_FILE cannot copy to a directory\n  ";
        local_c8._0_8_ = newname._M_string_length;
        local_c8._8_8_ = newname._M_dataplus._M_p;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_d8;
        cmCatViews_abi_cxx11_((string *)local_128,views_02);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00264bbd;
      }
      pcVar8 = "cannot copy to a directory";
      sVar9 = 0x1a;
    }
    bVar4 = true;
    value._M_str = pcVar8;
    value._M_len = sVar9;
    cmMakefile::AddDefinition(status->Makefile,psVar7,value);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "COPY_FILE unknown argument:\n  ",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8._0_8_;
    pAVar11 = (ActionMap *)local_d8._0_8_;
    if ((ActionMap *)local_d8._0_8_ != (ActionMap *)local_c8) {
LAB_002649de:
      operator_delete(pAVar11,(ulong)((long)&(pvVar10->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
    }
LAB_002649e6:
    bVar4 = false;
  }
LAB_002649e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arguments.Result._M_dataplus._M_p != paVar1) {
    operator_delete(arguments.Result._M_dataplus._M_p,
                    CONCAT71(arguments.Result.field_2._M_allocated_capacity._1_7_,
                             arguments.Result.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newname._M_dataplus._M_p != &newname.field_2) {
    operator_delete(newname._M_dataplus._M_p,newname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oldname._M_dataplus._M_p != &oldname.field_2) {
    operator_delete(oldname._M_dataplus._M_p,oldname.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}